

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O0

void __thiscall QJsonArray::insert(QJsonArray *this,qsizetype i,QJsonValue *value)

{
  bool bVar1;
  Type TVar2;
  QCborContainerPrivate *pQVar3;
  QCborContainerPrivate *in_RDX;
  undefined8 in_RSI;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  QCborContainerPrivate *in_stack_ffffffffffffff98;
  QCborContainerPrivate *in_stack_ffffffffffffffa0;
  QCborValue *this_00;
  qsizetype in_stack_ffffffffffffffb0;
  ContainerDisposition disp;
  QCborValue *in_stack_ffffffffffffffb8;
  QCborValue local_20;
  long local_8;
  
  disp = (ContainerDisposition)((ulong)in_RSI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QExplicitlySharedDataPointer::operator_cast_to_bool
                    ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x1abea4);
  if (bVar1) {
    pQVar3 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x1abeb4);
    QList<QtCbor::Element>::size(&pQVar3->elements);
    detach((QJsonArray *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  }
  else {
    in_stack_ffffffffffffffb8 = (QCborValue *)operator_new(0x40);
    QCborContainerPrivate::QCborContainerPrivate(in_stack_ffffffffffffffa0);
    QExplicitlySharedDataPointer<QCborContainerPrivate>::operator=
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
  }
  pQVar3 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x1abf03);
  TVar2 = QJsonValue::type((QJsonValue *)0x1abf1c);
  if (TVar2 == Undefined) {
    QCborValue::QCborValue(&local_20,(nullptr_t)0x0);
  }
  else {
    QCborValue::fromJsonValue((QJsonValue *)pQVar3);
  }
  this_00 = &local_20;
  QCborContainerPrivate::insertAt(in_RDX,in_RDI,in_stack_ffffffffffffffb8,disp);
  QCborValue::~QCborValue(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QJsonArray::insert(qsizetype i, const QJsonValue &value)
{
    if (a)
        detach(a->elements.size() + 1);
    else
        a = new QCborContainerPrivate;

    Q_ASSERT (i >= 0 && i <= a->elements.size());
    a->insertAt(i, value.type() == QJsonValue::Undefined ? QCborValue(nullptr)
                                                         : QCborValue::fromJsonValue(value));
}